

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void vocrevert(voccxdef *vctx)

{
  ushort uVar1;
  vocidef **ppvVar2;
  long lVar3;
  mcmcxdef *pmVar4;
  mcmodef *pmVar5;
  vocidef ***pppvVar6;
  ulong uVar7;
  int iVar8;
  objnum obj;
  ulong uVar9;
  long lVar10;
  ulong local_48;
  
  pppvVar6 = vctx->voccxinh;
  local_48 = 0;
  for (iVar8 = 0; iVar8 != 0x80; iVar8 = iVar8 + 1) {
    ppvVar2 = *pppvVar6;
    if (ppvVar2 != (vocidef **)0x0) {
      uVar9 = local_48;
      for (lVar10 = 0; (int)lVar10 != 0x800; lVar10 = lVar10 + 8) {
        lVar3 = *(long *)((long)ppvVar2 + lVar10);
        if (lVar3 != 0) {
          obj = (objnum)uVar9;
          if ((*(byte *)(lVar3 + 8) & 0x10) == 0) {
            pmVar4 = vctx->voccxmem;
            pmVar5 = pmVar4->mcmcxgl->mcmcxtab
                     [pmVar4->mcmcxmtb[uVar9 >> 8][(uint)uVar9 & 0xff] >> 8];
            uVar7 = (ulong)((pmVar4->mcmcxmtb[uVar9 >> 8][(uint)uVar9 & 0xff] & 0xff) << 5);
            uVar1 = *(ushort *)((long)&pmVar5->mcmoflg + uVar7);
            if ((uVar1 & 8) == 0) {
              *(ushort *)((long)&pmVar5->mcmoflg + uVar7) = uVar1 | 0x100;
            }
            else {
              (*pmVar4->mcmcxrvf)(pmVar4->mcmcxrvc,obj);
            }
          }
          else {
            vocidel(vctx,obj);
            vocdel(vctx,obj);
            mcmfre(vctx->voccxmem,obj);
          }
        }
        uVar9 = (ulong)((uint)uVar9 + 1);
      }
    }
    pppvVar6 = pppvVar6 + 1;
    local_48 = (ulong)((int)local_48 + 0x100);
  }
  vocdel1(vctx,0xffff,(char *)0x0,0,1,1,0);
  return;
}

Assistant:

void vocrevert(voccxdef *vctx)
{
    vocidef ***vpg;
    vocidef  **v;
    int        i;
    int        j;
    objnum     obj;

    /*
     *   Go through the inheritance records.  Delete each dynamically
     *   allocated object, and revert each static object to its original
     *   load state. 
     */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v)
            {
                /* if the object was dynamically allocated, delete it */
                if ((*v)->vociflg & VOCIFNEW)
                {
                    /* delete vocabulary and inheritance data for the object */
                    vocidel(vctx, obj);
                    vocdel(vctx, obj);

                    /* delete the object */
                    mcmfre(vctx->voccxmem, (mcmon)obj);
                }
                else
                {
                    /* revert the object */
                    mcmrevert(vctx->voccxmem, (mcmon)obj);
                }
            }
        }
    }

    /*
     *   Revert the vocabulary list: delete all newly added words, and
     *   undelete all original words marked as deleted.  
     */
    vocdel1(vctx, MCMONINV, (char *)0, 0, TRUE, TRUE, FALSE);
}